

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

RuleBasedNumberFormat * __thiscall
icu_63::RuleBasedNumberFormat::operator=(RuleBasedNumberFormat *this,RuleBasedNumberFormat *rhs)

{
  uint32_t *puVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  UErrorCode status;
  UParseError perror;
  undefined4 local_ac;
  UnicodeString local_a8 [2];
  BreakIterator *pBVar4;
  
  if (this != rhs) {
    NumberFormat::operator=(&this->super_NumberFormat,&rhs->super_NumberFormat);
    local_ac = 0;
    dispose(this);
    Locale::operator=(&this->locale,&rhs->locale);
    this->lenient = rhs->lenient;
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x32])
              (this,rhs->decimalFormatSymbols);
    if (rhs->localizations != (LocalizationInfo *)0x0) {
      puVar1 = &rhs->localizations->refcount;
      *puVar1 = *puVar1 + 1;
    }
    init(this,(EVP_PKEY_CTX *)&rhs->originalDescription);
    (*(rhs->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x30])(local_a8,rhs);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x2f])
              (this,local_a8,&local_ac);
    UnicodeString::~UnicodeString(local_a8);
    uVar2 = (*(rhs->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x22])(rhs);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x23])(this,(ulong)uVar2);
    this->capitalizationInfoSet = rhs->capitalizationInfoSet;
    this->capitalizationForUIListMenu = rhs->capitalizationForUIListMenu;
    this->capitalizationForStandAlone = rhs->capitalizationForStandAlone;
    if (rhs->capitalizationBrkIter == (BreakIterator *)0x0) {
      pBVar4 = (BreakIterator *)0x0;
    }
    else {
      iVar3 = (*(rhs->capitalizationBrkIter->super_UObject)._vptr_UObject[4])();
      pBVar4 = (BreakIterator *)CONCAT44(extraout_var,iVar3);
    }
    this->capitalizationBrkIter = pBVar4;
  }
  return this;
}

Assistant:

RuleBasedNumberFormat&
RuleBasedNumberFormat::operator=(const RuleBasedNumberFormat& rhs)
{
    if (this == &rhs) {
        return *this;
    }
    NumberFormat::operator=(rhs);
    UErrorCode status = U_ZERO_ERROR;
    dispose();
    locale = rhs.locale;
    lenient = rhs.lenient;

    UParseError perror;
    setDecimalFormatSymbols(*rhs.getDecimalFormatSymbols());
    init(rhs.originalDescription, rhs.localizations ? rhs.localizations->ref() : NULL, perror, status);
    setDefaultRuleSet(rhs.getDefaultRuleSetName(), status);
    setRoundingMode(rhs.getRoundingMode());

    capitalizationInfoSet = rhs.capitalizationInfoSet;
    capitalizationForUIListMenu = rhs.capitalizationForUIListMenu;
    capitalizationForStandAlone = rhs.capitalizationForStandAlone;
#if !UCONFIG_NO_BREAK_ITERATION
    capitalizationBrkIter = (rhs.capitalizationBrkIter!=NULL)? rhs.capitalizationBrkIter->clone(): NULL;
#endif

    return *this;
}